

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O0

void mir::inst::display_op(ostream *o,Op val)

{
  undefined4 in_ESI;
  ostream *in_RDI;
  
  switch(in_ESI) {
  case 0:
    std::operator<<(in_RDI,"+");
    break;
  case 1:
    std::operator<<(in_RDI,"-");
    break;
  case 2:
    std::operator<<(in_RDI,"*");
    break;
  case 3:
    std::operator<<(in_RDI,"/");
    break;
  case 4:
    std::operator<<(in_RDI,"MulSh");
    break;
  case 5:
    std::operator<<(in_RDI,"%");
    break;
  case 6:
    std::operator<<(in_RDI,">");
    break;
  case 7:
    std::operator<<(in_RDI,"<");
    break;
  case 8:
    std::operator<<(in_RDI,">=");
    break;
  case 9:
    std::operator<<(in_RDI,"<=");
    break;
  case 10:
    std::operator<<(in_RDI,"==");
    break;
  case 0xb:
    std::operator<<(in_RDI,"!=");
    break;
  case 0xc:
    std::operator<<(in_RDI,"&");
    break;
  case 0xd:
    std::operator<<(in_RDI,"|");
    break;
  case 0xe:
    std::operator<<(in_RDI,"^");
    break;
  case 0xf:
    std::operator<<(in_RDI,"!");
    break;
  case 0x10:
    std::operator<<(in_RDI,"<<");
    break;
  case 0x11:
    std::operator<<(in_RDI,">>>");
    break;
  case 0x12:
    std::operator<<(in_RDI,">>");
  }
  return;
}

Assistant:

void display_op(std::ostream& o, Op val) {
  switch (val) {
    case Op::Add:
      o << "+";
      break;
    case Op::Sub:
      o << "-";
      break;
    case Op::Mul:
      o << "*";
      break;
    case Op::MulSh:
      o << "MulSh";
      break;
    case Op::Div:
      o << "/";
      break;
    case Op::Rem:
      o << "%";
      break;
    case Op::Gt:
      o << ">";
      break;
    case Op::Lt:
      o << "<";
      break;
    case Op::Gte:
      o << ">=";
      break;
    case Op::Lte:
      o << "<=";
      break;
    case Op::Eq:
      o << "==";
      break;
    case Op::Neq:
      o << "!=";
      break;
    case Op::And:
      o << "&";
      break;
    case Op::Or:
      o << "|";
      break;
    case Op::Xor:
      o << "^";
      break;
    case Op::Not:
      o << "!";
      break;
    case Op::Shl:
      o << "<<";
      break;
    case Op::Shr:
      o << ">>>";
      break;
    case Op::ShrA:
      o << ">>";
      break;
  }
}